

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O3

void __thiscall VarianceEstimator_Zero_Test::TestBody(VarianceEstimator_Zero_Test *this)

{
  float fVar1;
  bool bVar2;
  long lVar3;
  char *message;
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  AssertionResult gtest_ar;
  Message local_28;
  AssertHelper local_20;
  internal local_18 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  
  auVar4 = ZEXT816(0) << 0x40;
  lVar3 = 1;
  fVar5 = 0.0;
  do {
    fVar6 = (float)lVar3;
    fVar1 = 10.0 - fVar5;
    lVar3 = lVar3 + 1;
    fVar5 = fVar5 + fVar1 / fVar6;
    auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar1),ZEXT416((uint)(10.0 - fVar5)));
  } while (lVar3 != 0x65);
  local_28.ss_.ptr_._0_4_ = auVar4._0_4_ / 99.0;
  local_20.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<float,int>
            (local_18,"ve.Variance()","0",(float *)&local_28,(int *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message(&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x398,message);
    testing::internal::AssertHelper::operator=(&local_20,&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(VarianceEstimator, Zero) {
    VarianceEstimator<Float> ve;
    for (int i = 0; i < 100; ++i)
        ve.Add(10.);
    EXPECT_EQ(ve.Variance(), 0);
}